

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall Scene::addLight(Scene *this,Light *light)

{
  Light *pLVar1;
  pointer ppLVar2;
  Light *local_20;
  Light *light_local;
  
  ppLVar2 = (this->lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppLVar2 ==
        (this->lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_20 = light;
      std::vector<Light_*,_std::allocator<Light_*>_>::push_back(&this->lights,&local_20);
      return;
    }
    pLVar1 = *ppLVar2;
    ppLVar2 = ppLVar2 + 1;
  } while (pLVar1 != light);
  return;
}

Assistant:

void Scene::addLight(Light * light)
{
	for (Light* l : lights)
	{
		if (l == light)
		{
			return;
		}
	}
	lights.push_back(light);
}